

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void reduce_by_index_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  byte extraout_AL;
  int iVar5;
  FlowBuilder *this;
  size_type sVar6;
  pointer *__stat_loc;
  uint in_EDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Expression_lhs<const_int_&> EVar7;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  IndexRange<unsigned_long> range;
  int sol;
  int sum;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  int *i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffb88;
  Task *tasks;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  Executor *this_00;
  allocator_type *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  Enum in_stack_fffffffffffffbac;
  Taskflow *in_stack_fffffffffffffbb0;
  Executor *in_stack_fffffffffffffbc0;
  anon_class_24_3_10b1740b *c_00;
  ExpressionDecomposer local_404;
  Taskflow *local_400;
  Enum local_3f8;
  int *in_stack_fffffffffffffc10;
  Expression_lhs<const_int_&> *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  __basic_future<void> local_358 [2];
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  Executor *local_328;
  undefined1 *local_318;
  IndexRange<unsigned_long> *local_310;
  FlowBuilder local_308;
  Task local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined4 *local_2e8;
  undefined1 local_2d8 [24];
  undefined4 local_2c0;
  undefined4 local_2bc;
  long local_2b8;
  int *local_2b0;
  int *local_2a8;
  int local_29c [5];
  initializer_list<int> local_288;
  initializer_list<int> *local_278;
  ulong local_270;
  reference local_268;
  int *local_260;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_258;
  undefined1 *local_250;
  undefined1 local_241 [25];
  Executor local_228;
  
  this = (FlowBuilder *)(ulong)in_EDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc78);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x186fc6);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffbb0);
  c_00 = (anon_class_24_3_10b1740b *)local_241;
  std::allocator<int>::allocator((allocator<int> *)0x186fe7);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),in_stack_fffffffffffffba0
            );
  std::allocator<int>::~allocator((allocator<int> *)0x18700d);
  local_250 = local_241 + 1;
  local_258._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb88);
  local_260 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb88);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffb88);
    if (!bVar4) break;
    local_268 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_258);
    iVar5 = rand();
    *local_268 = iVar5 % 100 + -0x32;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_258);
  }
  local_270 = 1;
  do {
    uVar3 = local_270;
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_241 + 1));
    if (sVar6 <= uVar3) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba0);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      tf::Executor::~Executor(in_stack_fffffffffffffbc0);
      return;
    }
    local_29c[0] = 0;
    local_29c[1] = 1;
    local_29c[2] = 3;
    local_29c[3] = 7;
    local_29c[4] = 99;
    local_288._M_array = local_29c;
    local_288._M_len = 5;
    local_278 = &local_288;
    local_2a8 = std::initializer_list<int>::begin(local_278);
    local_2b0 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    for (; local_2a8 != local_2b0; local_2a8 = local_2a8 + 1) {
      local_2b8 = (long)*local_2a8;
      in_stack_fffffffffffffbc0 = &local_228;
      tf::Taskflow::clear((Taskflow *)0x1871fb);
      local_2bc = 10;
      local_2c0 = 10;
      local_2f8 = local_2d8;
      local_2f0 = local_241 + 1;
      local_2e8 = &local_2bc;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:423:37),_nullptr>
                (this,c_00);
      tf::Task::Task(&local_300);
      local_310 = (IndexRange<unsigned_long> *)
                  std::ref<tf::IndexRange<unsigned_long>>
                            ((IndexRange<unsigned_long> *)in_stack_fffffffffffffb88);
      local_318 = local_241 + 1;
      tf::RandomPartitioner<tf::DefaultClosureWrapper>::RandomPartitioner
                ((RandomPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_t)in_stack_fffffffffffffb88);
      tasks = (Task *)CONCAT44(uStack_334,local_338);
      in_stack_fffffffffffffb90 = uStack_330;
      in_stack_fffffffffffffb94 = uStack_32c;
      this_00 = local_328;
      tf::FlowBuilder::
      reduce_by_index<std::reference_wrapper<tf::IndexRange<unsigned_long>>,int,reduce_by_index_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<unsigned_long>,std::optional<int>)_1_,std::plus<int>,tf::RandomPartitioner<tf::DefaultClosureWrapper>>
                (&local_308,&local_228,local_310,&local_2c0,local_318);
      tf::Task::operator=(&local_300,(Task *)&local_308);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),tasks);
      __stat_loc = (pointer *)
                   ((long)&local_228._buffers._buckets.
                           super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                           ._M_impl.super__Vector_impl_data + 0x10);
      tf::Executor::run(this_00,(Taskflow *)
                                CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      iVar5 = (int)((ulong)this_00 >> 0x20);
      std::__basic_future<void>::wait(local_358,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      in_stack_fffffffffffffb88 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                 (char *)in_stack_fffffffffffffba0,iVar5,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),"",
                 (char *)in_stack_fffffffffffffbc0);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_404,DT_REQUIRE);
      EVar7 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                         (int *)in_stack_fffffffffffffb88);
      in_stack_fffffffffffffbb0 = (Taskflow *)EVar7.lhs;
      in_stack_fffffffffffffbac = EVar7.m_at;
      local_400 = in_stack_fffffffffffffbb0;
      local_3f8 = in_stack_fffffffffffffbac;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb88);
      doctest::detail::Result::~Result((Result *)0x187421);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&stack0xfffffffffffffc30,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x187530);
    }
    local_270 = local_270 + 1;
  } while( true );
}

Assistant:

void reduce_by_index_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {
      
      taskflow.clear();

      int sum = 10;
      int sol = 10;
      tf::IndexRange<size_t> range;

      auto stask = taskflow.emplace([&](){
        range.reset(0, vec.size(), 1);
        REQUIRE(range.size() == vec.size());
        for(auto itr = vec.begin(); itr != vec.end(); itr++) {
          sum += *itr;
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce_by_index(
        std::ref(range),
        sol,
        [&](tf::IndexRange<size_t> subrange, std::optional<int> running_total){
          int lsum = running_total ? *running_total : 0;
          for(size_t i=subrange.begin(); i<subrange.end(); i+=subrange.step_size()) {
            lsum += vec[i];
          }
          return lsum;
        },
        std::plus<int>(), 
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}